

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O0

bool CreateSig(BaseSignatureCreator *creator,SignatureData *sigdata,SigningProvider *provider,
              vector<unsigned_char,_std::allocator<unsigned_char>_> *sig_out,CPubKey *pubkey,
              CScript *scriptcode,SigVersion sigversion)

{
  bool bVar1;
  byte bVar2;
  iterator this;
  CKeyID *__args;
  undefined8 in_RCX;
  long *in_RDX;
  long in_RSI;
  long *in_RDI;
  undefined8 in_R9;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_bool>
  pVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_bool>
  pVar4;
  undefined4 in_stack_00000008;
  iterator it;
  pair<std::_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_bool>
  i;
  KeyOriginInfo info;
  CKeyID keyid;
  pair<CPubKey,_KeyOriginInfo> *in_stack_fffffffffffffe28;
  undefined6 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe36;
  undefined1 in_stack_fffffffffffffe37;
  pair<CPubKey,_KeyOriginInfo> *in_stack_fffffffffffffe38;
  CKeyID *in_stack_fffffffffffffe40;
  undefined6 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4e;
  undefined1 in_stack_fffffffffffffe4f;
  CPubKey *in_stack_fffffffffffffe50;
  bool local_149;
  undefined1 in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec1;
  undefined1 local_108 [236];
  undefined1 local_1c [20];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CPubKey::GetID(in_stack_fffffffffffffe50);
  std::
  map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  ::find((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
          *)CONCAT17(in_stack_fffffffffffffe37,
                     CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
         (key_type *)in_stack_fffffffffffffe28);
  this = std::
         map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
         ::end((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffe37,
                           CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)));
  bVar1 = std::operator==((_Self *)in_stack_fffffffffffffe38,
                          (_Self *)CONCAT17(in_stack_fffffffffffffe37,
                                            CONCAT16(in_stack_fffffffffffffe36,
                                                     in_stack_fffffffffffffe30)));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    KeyOriginInfo::KeyOriginInfo((KeyOriginInfo *)in_stack_fffffffffffffe28);
    bVar2 = (**(code **)(*in_RDX + 0x38))(in_RDX,local_1c,local_108);
    if ((bVar2 & 1) != 0) {
      std::make_pair<CPubKey_const&,KeyOriginInfo>
                ((CPubKey *)
                 CONCAT17(in_stack_fffffffffffffe37,
                          CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
                 (KeyOriginInfo *)in_stack_fffffffffffffe28);
      pVar3 = std::
              map<CKeyID,std::pair<CPubKey,KeyOriginInfo>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>
              ::emplace<CKeyID&,std::pair<CPubKey,KeyOriginInfo>>
                        ((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffe4f,
                                     CONCAT16(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe48)),
                         in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      in_stack_fffffffffffffe4f = pVar3.second;
      std::pair<CPubKey,_KeyOriginInfo>::~pair(in_stack_fffffffffffffe28);
    }
    bVar2 = (**(code **)(*in_RDI + 0x18))(in_RDI,in_RDX,in_RCX,local_1c,in_R9,in_stack_00000008);
    if ((bVar2 & 1) == 0) {
      std::vector<CKeyID,_std::allocator<CKeyID>_>::push_back
                ((vector<CKeyID,_std::allocator<CKeyID>_> *)in_stack_fffffffffffffe38,
                 (value_type *)
                 CONCAT17(in_stack_fffffffffffffe37,
                          CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)));
      local_149 = false;
    }
    else {
      __args = (CKeyID *)(in_RSI + 0x160);
      std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
      pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_true>
                ((pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                 in_stack_fffffffffffffe38,
                 (CPubKey *)
                 CONCAT17(in_stack_fffffffffffffe37,
                          CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe28)
      ;
      pVar4 = std::
              map<CKeyID,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
              ::
              emplace<CKeyID&,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        ((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffe4f,
                                     CONCAT16(bVar2,in_stack_fffffffffffffe48)),__args,
                         (pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)in_stack_fffffffffffffe38);
      std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~pair
                ((pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                 in_stack_fffffffffffffe28);
      if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        __assert_fail("i.second",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/sign.cpp"
                      ,0x92,
                      "bool CreateSig(const BaseSignatureCreator &, SignatureData &, const SigningProvider &, std::vector<unsigned char> &, const CPubKey &, const CScript &, SigVersion)"
                     );
      }
      local_149 = true;
    }
    KeyOriginInfo::~KeyOriginInfo((KeyOriginInfo *)in_stack_fffffffffffffe28);
  }
  else {
    std::
    _Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)in_stack_fffffffffffffe28);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this._M_node,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT71(in_stack_fffffffffffffec1,in_stack_fffffffffffffec0));
    local_149 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_149;
}

Assistant:

static bool CreateSig(const BaseSignatureCreator& creator, SignatureData& sigdata, const SigningProvider& provider, std::vector<unsigned char>& sig_out, const CPubKey& pubkey, const CScript& scriptcode, SigVersion sigversion)
{
    CKeyID keyid = pubkey.GetID();
    const auto it = sigdata.signatures.find(keyid);
    if (it != sigdata.signatures.end()) {
        sig_out = it->second.second;
        return true;
    }
    KeyOriginInfo info;
    if (provider.GetKeyOrigin(keyid, info)) {
        sigdata.misc_pubkeys.emplace(keyid, std::make_pair(pubkey, std::move(info)));
    }
    if (creator.CreateSig(provider, sig_out, keyid, scriptcode, sigversion)) {
        auto i = sigdata.signatures.emplace(keyid, SigPair(pubkey, sig_out));
        assert(i.second);
        return true;
    }
    // Could not make signature or signature not found, add keyid to missing
    sigdata.missing_sigs.push_back(keyid);
    return false;
}